

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RoboSimian.cpp
# Opt level: O2

shared_ptr<chrono::ChMaterialSurface> __thiscall
chrono::robosimian::DefaultContactMaterial(robosimian *this,ChContactMethod contact_method)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  shared_ptr<chrono::ChMaterialSurface> sVar2;
  shared_ptr<chrono::ChMaterialSurfaceNSC> matNSC;
  long local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_20 [2];
  
  if (contact_method == SMC) {
    std::make_shared<chrono::ChMaterialSurfaceSMC>();
    chrono::ChMaterialSurface::SetFriction(0.8);
    *(undefined8 *)(local_28 + 0x18) = 0x4b98968000000000;
    *(undefined4 *)(local_28 + 0x20) = 0x3e99999a;
    *(undefined8 *)(local_28 + 0x30) = 0x4843500048435000;
    *(undefined8 *)(local_28 + 0x38) = 0x41a0000042200000;
    _Var1._M_pi = a_Stack_20[0]._M_pi;
  }
  else {
    if (contact_method != NSC) {
      *(undefined8 *)this = 0;
      *(undefined8 *)(this + 8) = 0;
      goto LAB_001602e7;
    }
    std::make_shared<chrono::ChMaterialSurfaceNSC>();
    chrono::ChMaterialSurface::SetFriction(0.8);
    *(undefined4 *)(local_28 + 0x18) = 0;
    _Var1._M_pi = a_Stack_20[0]._M_pi;
  }
  a_Stack_20[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(long *)this = local_28;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = _Var1._M_pi;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_20);
  in_RDX._M_pi = extraout_RDX;
LAB_001602e7:
  sVar2.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = in_RDX._M_pi;
  sVar2.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<chrono::ChMaterialSurface>)
         sVar2.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ChMaterialSurface> DefaultContactMaterial(ChContactMethod contact_method) {
    float mu = 0.8f;   // coefficient of friction
    float cr = 0.0f;   // coefficient of restitution
    float Y = 2e7f;    // Young's modulus
    float nu = 0.3f;   // Poisson ratio
    float kn = 2e5f;   // normal stiffness
    float gn = 40.0f;  // normal viscous damping
    float kt = 2e5f;   // tangential stiffness
    float gt = 20.0f;  // tangential viscous damping

    switch (contact_method) {
        case ChContactMethod::NSC: {
            auto matNSC = chrono_types::make_shared<ChMaterialSurfaceNSC>();
            matNSC->SetFriction(mu);
            matNSC->SetRestitution(cr);
            return matNSC;
        }
        case ChContactMethod::SMC: {
            auto matSMC = chrono_types::make_shared<ChMaterialSurfaceSMC>();
            matSMC->SetFriction(mu);
            matSMC->SetRestitution(cr);
            matSMC->SetYoungModulus(Y);
            matSMC->SetPoissonRatio(nu);
            matSMC->SetKn(kn);
            matSMC->SetGn(gn);
            matSMC->SetKt(kt);
            matSMC->SetGt(gt);
            return matSMC;
        }
        default:
            return std::shared_ptr<ChMaterialSurface>();
    }
}